

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cffload.c
# Opt level: O0

FT_Error cff_vstore_load(CFF_VStoreRec *vstore,FT_Stream stream,FT_ULong base_offset,FT_ULong offset
                        )

{
  FT_UShort FVar1;
  FT_UShort FVar2;
  FT_UShort FVar3;
  FT_ULong FVar4;
  FT_ULong FVar5;
  FT_ULong FVar6;
  FT_Pointer pvVar7;
  long *plVar8;
  long *plVar9;
  uint *puVar10;
  CFF_VarData *data;
  FT_Int16 end14;
  FT_Int16 peak14;
  FT_Int16 start14;
  CFF_AxisCoords *axis;
  CFF_VarRegion *region;
  FT_ULong regionListOffset;
  FT_UInt format;
  FT_UInt vsOffset;
  FT_UInt j;
  FT_UInt i;
  FT_ULong *dataOffsetArray;
  FT_Memory pFStack_30;
  FT_Error error;
  FT_Memory memory;
  FT_ULong offset_local;
  FT_ULong base_offset_local;
  FT_Stream stream_local;
  CFF_VStoreRec *vstore_local;
  
  pFStack_30 = stream->memory;
  dataOffsetArray._4_4_ = 3;
  _j = (FT_Pointer)0x0;
  memory = (FT_Memory)offset;
  offset_local = base_offset;
  base_offset_local = (FT_ULong)stream;
  stream_local = (FT_Stream)vstore;
  if (offset != 0) {
    dataOffsetArray._4_4_ = FT_Stream_Seek(stream,base_offset + offset);
    if ((dataOffsetArray._4_4_ != 0) ||
       (dataOffsetArray._4_4_ = FT_Stream_Skip((FT_Stream)base_offset_local,2),
       dataOffsetArray._4_4_ != 0)) goto LAB_002f3257;
    FVar4 = FT_Stream_Pos((FT_Stream)base_offset_local);
    FVar1 = FT_Stream_ReadUShort
                      ((FT_Stream)base_offset_local,(FT_Error *)((long)&dataOffsetArray + 4));
    if (dataOffsetArray._4_4_ != 0) goto LAB_002f3257;
    if (FVar1 != 1) {
      dataOffsetArray._4_4_ = 3;
      goto LAB_002f3257;
    }
    FVar5 = FT_Stream_ReadULong((FT_Stream)base_offset_local,
                                (FT_Error *)((long)&dataOffsetArray + 4));
    if (dataOffsetArray._4_4_ != 0) goto LAB_002f3257;
    FVar1 = FT_Stream_ReadUShort
                      ((FT_Stream)base_offset_local,(FT_Error *)((long)&dataOffsetArray + 4));
    *(uint *)&stream_local->base = (uint)FVar1;
    if ((dataOffsetArray._4_4_ != 0) ||
       (_j = ft_mem_realloc(pFStack_30,8,0,(ulong)*(uint *)&stream_local->base,(void *)0x0,
                            (FT_Error *)((long)&dataOffsetArray + 4)), dataOffsetArray._4_4_ != 0))
    goto LAB_002f3257;
    for (vsOffset = 0; vsOffset < *(uint *)&stream_local->base; vsOffset = vsOffset + 1) {
      FVar6 = FT_Stream_ReadULong((FT_Stream)base_offset_local,
                                  (FT_Error *)((long)&dataOffsetArray + 4));
      *(FT_ULong *)((long)_j + (ulong)vsOffset * 8) = FVar6;
      if (dataOffsetArray._4_4_ != 0) goto LAB_002f3257;
    }
    dataOffsetArray._4_4_ =
         FT_Stream_Seek((FT_Stream)base_offset_local,(FVar4 & 0xffffffff) + FVar5);
    if (dataOffsetArray._4_4_ != 0) goto LAB_002f3257;
    FVar1 = FT_Stream_ReadUShort
                      ((FT_Stream)base_offset_local,(FT_Error *)((long)&dataOffsetArray + 4));
    *(FT_UShort *)&stream_local->pos = FVar1;
    if (dataOffsetArray._4_4_ != 0) goto LAB_002f3257;
    FVar1 = FT_Stream_ReadUShort
                      ((FT_Stream)base_offset_local,(FT_Error *)((long)&dataOffsetArray + 4));
    *(uint *)((long)&stream_local->pos + 4) = (uint)FVar1;
    if (dataOffsetArray._4_4_ != 0) goto LAB_002f3257;
    pvVar7 = ft_mem_realloc(pFStack_30,8,0,(ulong)*(uint *)((long)&stream_local->pos + 4),
                            (void *)0x0,(FT_Error *)((long)&dataOffsetArray + 4));
    (stream_local->descriptor).pointer = pvVar7;
    if (dataOffsetArray._4_4_ != 0) goto LAB_002f3257;
    for (vsOffset = 0; vsOffset < *(uint *)((long)&stream_local->pos + 4); vsOffset = vsOffset + 1)
    {
      plVar8 = (long *)((long)(stream_local->descriptor).pointer + (ulong)vsOffset * 8);
      pvVar7 = ft_mem_realloc(pFStack_30,0x18,0,(ulong)(ushort)stream_local->pos,(void *)0x0,
                              (FT_Error *)((long)&dataOffsetArray + 4));
      *plVar8 = (long)pvVar7;
      if (dataOffsetArray._4_4_ != 0) goto LAB_002f3257;
      for (format = 0; format < (ushort)stream_local->pos; format = format + 1) {
        plVar9 = (long *)(*plVar8 + (ulong)format * 0x18);
        FVar1 = FT_Stream_ReadUShort
                          ((FT_Stream)base_offset_local,(FT_Error *)((long)&dataOffsetArray + 4));
        if (((dataOffsetArray._4_4_ != 0) ||
            (FVar2 = FT_Stream_ReadUShort
                               ((FT_Stream)base_offset_local,
                                (FT_Error *)((long)&dataOffsetArray + 4)),
            dataOffsetArray._4_4_ != 0)) ||
           (FVar3 = FT_Stream_ReadUShort
                              ((FT_Stream)base_offset_local,(FT_Error *)((long)&dataOffsetArray + 4)
                              ), dataOffsetArray._4_4_ != 0)) goto LAB_002f3257;
        *plVar9 = (long)(short)FVar1 << 2;
        plVar9[1] = (long)(short)FVar2 << 2;
        plVar9[2] = (long)(short)FVar3 << 2;
      }
    }
    pvVar7 = ft_mem_realloc(pFStack_30,0x10,0,(ulong)*(uint *)&stream_local->base,(void *)0x0,
                            (FT_Error *)((long)&dataOffsetArray + 4));
    stream_local->size = (unsigned_long)pvVar7;
    if (dataOffsetArray._4_4_ != 0) goto LAB_002f3257;
    for (vsOffset = 0; vsOffset < *(uint *)&stream_local->base; vsOffset = vsOffset + 1) {
      puVar10 = (uint *)(stream_local->size + (ulong)vsOffset * 0x10);
      dataOffsetArray._4_4_ =
           FT_Stream_Seek((FT_Stream)base_offset_local,
                          (FVar4 & 0xffffffff) + *(long *)((long)_j + (ulong)vsOffset * 8));
      if ((dataOffsetArray._4_4_ != 0) ||
         (dataOffsetArray._4_4_ = FT_Stream_Skip((FT_Stream)base_offset_local,4),
         dataOffsetArray._4_4_ != 0)) goto LAB_002f3257;
      FVar1 = FT_Stream_ReadUShort
                        ((FT_Stream)base_offset_local,(FT_Error *)((long)&dataOffsetArray + 4));
      *puVar10 = (uint)FVar1;
      if (dataOffsetArray._4_4_ != 0) goto LAB_002f3257;
      pvVar7 = ft_mem_realloc(pFStack_30,4,0,(ulong)*puVar10,(void *)0x0,
                              (FT_Error *)((long)&dataOffsetArray + 4));
      *(FT_Pointer *)(puVar10 + 2) = pvVar7;
      if (dataOffsetArray._4_4_ != 0) goto LAB_002f3257;
      for (format = 0; format < *puVar10; format = format + 1) {
        FVar1 = FT_Stream_ReadUShort
                          ((FT_Stream)base_offset_local,(FT_Error *)((long)&dataOffsetArray + 4));
        *(uint *)(*(long *)(puVar10 + 2) + (ulong)format * 4) = (uint)FVar1;
        if (dataOffsetArray._4_4_ != 0) goto LAB_002f3257;
      }
    }
  }
  dataOffsetArray._4_4_ = 0;
LAB_002f3257:
  ft_mem_free(pFStack_30,_j);
  if (dataOffsetArray._4_4_ != 0) {
    cff_vstore_done((CFF_VStoreRec *)stream_local,pFStack_30);
  }
  return dataOffsetArray._4_4_;
}

Assistant:

static FT_Error
  cff_vstore_load( CFF_VStoreRec*  vstore,
                   FT_Stream       stream,
                   FT_ULong        base_offset,
                   FT_ULong        offset )
  {
    FT_Memory  memory = stream->memory;
    FT_Error   error  = FT_ERR( Invalid_File_Format );

    FT_ULong*  dataOffsetArray = NULL;
    FT_UInt    i, j;


    /* no offset means no vstore to parse */
    if ( offset )
    {
      FT_UInt   vsOffset;
      FT_UInt   format;
      FT_ULong  regionListOffset;


      /* we need to parse the table to determine its size; */
      /* skip table length                                 */
      if ( FT_STREAM_SEEK( base_offset + offset ) ||
           FT_STREAM_SKIP( 2 )                    )
        goto Exit;

      /* actual variation store begins after the length */
      vsOffset = FT_STREAM_POS();

      /* check the header */
      if ( FT_READ_USHORT( format ) )
        goto Exit;
      if ( format != 1 )
      {
        error = FT_THROW( Invalid_File_Format );
        goto Exit;
      }

      /* read top level fields */
      if ( FT_READ_ULONG( regionListOffset )   ||
           FT_READ_USHORT( vstore->dataCount ) )
        goto Exit;

      /* make temporary copy of item variation data offsets; */
      /* we'll parse region list first, then come back       */
      if ( FT_NEW_ARRAY( dataOffsetArray, vstore->dataCount ) )
        goto Exit;

      for ( i = 0; i < vstore->dataCount; i++ )
      {
        if ( FT_READ_ULONG( dataOffsetArray[i] ) )
          goto Exit;
      }

      /* parse regionList and axisLists */
      if ( FT_STREAM_SEEK( vsOffset + regionListOffset ) ||
           FT_READ_USHORT( vstore->axisCount )           ||
           FT_READ_USHORT( vstore->regionCount )         )
        goto Exit;

      if ( FT_NEW_ARRAY( vstore->varRegionList, vstore->regionCount ) )
        goto Exit;

      for ( i = 0; i < vstore->regionCount; i++ )
      {
        CFF_VarRegion*  region = &vstore->varRegionList[i];


        if ( FT_NEW_ARRAY( region->axisList, vstore->axisCount ) )
          goto Exit;

        for ( j = 0; j < vstore->axisCount; j++ )
        {
          CFF_AxisCoords*  axis = &region->axisList[j];

          FT_Int16  start14, peak14, end14;


          if ( FT_READ_SHORT( start14 ) ||
               FT_READ_SHORT( peak14 )  ||
               FT_READ_SHORT( end14 )   )
            goto Exit;

          axis->startCoord = FT_fdot14ToFixed( start14 );
          axis->peakCoord  = FT_fdot14ToFixed( peak14 );
          axis->endCoord   = FT_fdot14ToFixed( end14 );
        }
      }

      /* use dataOffsetArray now to parse varData items */
      if ( FT_NEW_ARRAY( vstore->varData, vstore->dataCount ) )
        goto Exit;

      for ( i = 0; i < vstore->dataCount; i++ )
      {
        CFF_VarData*  data = &vstore->varData[i];


        if ( FT_STREAM_SEEK( vsOffset + dataOffsetArray[i] ) )
          goto Exit;

        /* ignore `itemCount' and `shortDeltaCount' */
        /* because CFF2 has no delta sets           */
        if ( FT_STREAM_SKIP( 4 ) )
          goto Exit;

        /* Note: just record values; consistency is checked later    */
        /*       by cff_blend_build_vector when it consumes `vstore' */

        if ( FT_READ_USHORT( data->regionIdxCount ) )
          goto Exit;

        if ( FT_NEW_ARRAY( data->regionIndices, data->regionIdxCount ) )
          goto Exit;

        for ( j = 0; j < data->regionIdxCount; j++ )
        {
          if ( FT_READ_USHORT( data->regionIndices[j] ) )
            goto Exit;
        }
      }
    }

    error = FT_Err_Ok;

  Exit:
    FT_FREE( dataOffsetArray );
    if ( error )
      cff_vstore_done( vstore, memory );

    return error;
  }